

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O3

void test_register_request_target(void)

{
  int iVar1;
  cio_error cVar2;
  cio_inet_address *arg1;
  long lVar3;
  register_request_target_args args [3];
  cio_http_location target;
  cio_http_server_configuration config;
  cio_http_server server;
  undefined8 auStack_2a8 [2];
  cio_http_server *local_298;
  cio_http_location *local_290;
  undefined4 local_288;
  undefined8 local_280;
  cio_http_location *local_278;
  undefined4 local_270;
  cio_http_server *local_268;
  undefined8 local_260;
  undefined4 local_258;
  cio_http_location local_248;
  cio_http_server_configuration local_228;
  cio_http_server local_170;
  
  auStack_2a8[1] = 0x10771e;
  memcpy(&local_228,&DAT_001189e0,0xb8);
  auStack_2a8[1] = 0x107723;
  arg1 = cio_get_inet_address_any4();
  auStack_2a8[1] = 0x107733;
  cio_init_inet_socket_address(&local_228.endpoint,arg1,0x1f90);
  auStack_2a8[1] = 0x10774d;
  cVar2 = cio_http_server_init(&local_170,&loop,&local_228);
  auStack_2a8[1] = 0x10776c;
  UnityAssertEqualNumber
            (0,(long)cVar2,"Server initialization failed!",0x42f,UNITY_DISPLAY_STYLE_INT);
  auStack_2a8[1] = 0x107789;
  cVar2 = cio_http_location_init(&local_248,"/foo",(void *)0x0,alloc_dummy_handler);
  auStack_2a8[1] = 0x1077a5;
  UnityAssertEqualNumber
            (0,(long)cVar2,"Request target initialization failed!",0x433,UNITY_DISPLAY_STYLE_INT);
  local_298 = &local_170;
  local_290 = &local_248;
  local_288 = 0;
  local_280 = 0;
  local_278 = &local_248;
  local_270 = 0xffffffea;
  local_268 = &local_170;
  local_260 = 0;
  local_258 = 0xffffffea;
  lVar3 = 0x10;
  do {
    iVar1 = *(int *)((long)&local_298 + lVar3);
    auStack_2a8[1] = 0x1077fe;
    cVar2 = cio_http_server_register_location
                      (*(cio_http_server **)((long)auStack_2a8 + lVar3),
                       *(cio_http_location **)((long)auStack_2a8 + lVar3 + 8));
    auStack_2a8[1] = 0x107817;
    UnityAssertEqualNumber
              ((long)iVar1,(long)cVar2,"Register request target not handled correctly!",0x43e,
               UNITY_DISPLAY_STYLE_INT);
    auStack_2a8[1] = 0x107826;
    free(&client_socket[-2].impl.close_timer.impl.ev.fd);
    auStack_2a8[1] = 0x10782b;
    setUp();
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x58);
  auStack_2a8[1] = 0x107848;
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_register_request_target(void)
{
	struct register_request_target_args {
		struct cio_http_server *server;
		struct cio_http_location *target;
		enum cio_error expected_result;
	};

	struct cio_http_server_configuration config = {
	    .on_error = serve_error,
	    .read_header_timeout_ns = header_read_timeout,
	    .read_body_timeout_ns = body_read_timeout,
	    .response_timeout_ns = response_timeout,
	    .close_timeout_ns = 10,
	    .alloc_client = alloc_dummy_client,
	    .free_client = free_dummy_client};

	cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

	struct cio_http_server server;
	enum cio_error err = cio_http_server_init(&server, &loop, &config);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

	struct cio_http_location target;
	err = cio_http_location_init(&target, "/foo", NULL, alloc_dummy_handler);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");

	struct register_request_target_args args[] = {
	    {.server = &server, .target = &target, .expected_result = CIO_SUCCESS},
	    {.server = NULL, .target = &target, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .target = NULL, .expected_result = CIO_INVALID_ARGUMENT},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(args); i++) {
		struct register_request_target_args arg = args[i];
		err = cio_http_server_register_location(arg.server, arg.target);
		TEST_ASSERT_EQUAL_MESSAGE(arg.expected_result, err, "Register request target not handled correctly!");

		free_dummy_client(client_socket);
		setUp();
	}

	free_dummy_client(client_socket);
}